

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

bool __thiscall cmFileCopier::GetDefaultDirectoryPermissions(cmFileCopier *this,mode_t **mode)

{
  cmMakefile *this_00;
  cmCommand *this_01;
  bool bVar1;
  char *pcVar2;
  reference arg_00;
  ostream *poVar3;
  string local_258;
  undefined1 local_238 [8];
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_98;
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *default_dir_install_permissions;
  mode_t **mode_local;
  cmFileCopier *this_local;
  
  this_00 = this->Makefile;
  default_dir_install_permissions = (char *)mode;
  mode_local = (mode_t **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS",&local_49);
  pcVar2 = cmMakefile::GetDefinition(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
    default_dir_install_permissions[0] = '\0';
    default_dir_install_permissions[1] = '\0';
    default_dir_install_permissions[2] = '\0';
    default_dir_install_permissions[3] = '\0';
    default_dir_install_permissions[4] = '\0';
    default_dir_install_permissions[5] = '\0';
    default_dir_install_permissions[6] = '\0';
    default_dir_install_permissions[7] = '\0';
  }
  else {
    local_28 = pcVar2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_78);
    pcVar2 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,pcVar2,(allocator<char> *)((long)&__range2 + 7));
    cmSystemTools::ExpandListArgument
              (&local_98,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_78,false);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_78);
    arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&arg), bVar1) {
      arg_00 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      bVar1 = CheckPermissions(this,arg_00,*(mode_t **)default_dir_install_permissions);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
        pcVar2 = cmCommand::GetError(&this->FileCommand->super_cmCommand);
        poVar3 = std::operator<<((ostream *)local_238,pcVar2);
        std::operator<<(poVar3," Set with CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS variable.");
        this_01 = &this->FileCommand->super_cmCommand;
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(this_01,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        this_local._7_1_ = 0;
        bVar1 = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
        goto LAB_00493cf4;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    bVar1 = false;
LAB_00493cf4:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_78);
    if (bVar1) goto LAB_00493d27;
  }
  this_local._7_1_ = 1;
LAB_00493d27:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCopier::GetDefaultDirectoryPermissions(mode_t** mode)
{
  // check if default dir creation permissions were set
  const char* default_dir_install_permissions = this->Makefile->GetDefinition(
    "CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS");
  if (default_dir_install_permissions && *default_dir_install_permissions) {
    std::vector<std::string> items;
    cmSystemTools::ExpandListArgument(default_dir_install_permissions, items);
    for (const auto& arg : items) {
      if (!this->CheckPermissions(arg, **mode)) {
        std::ostringstream e;
        e << this->FileCommand->GetError()
          << " Set with CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS "
             "variable.";
        this->FileCommand->SetError(e.str());
        return false;
      }
    }
  } else {
    *mode = nullptr;
  }

  return true;
}